

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

bool __thiscall
ON_SubDLimitMeshSealEdgeInfo::SetEdge(ON_SubDLimitMeshSealEdgeInfo *this,uint grid_side_dex)

{
  undefined2 uVar1;
  ON_SubDMeshFragment *pOVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  ON_SubDEdge *this_00;
  ON__UINT_PTR OVar6;
  byte bVar7;
  byte bVar8;
  ON_SubDEdgePtr eptr;
  ON_SubDEdgePtr local_28;
  
  pOVar2 = this->m_fragment;
  if (((pOVar2 == (ON_SubDMeshFragment *)0x0) || (pOVar2->m_face == (ON_SubDFace *)0x0)) ||
     (uVar1 = pOVar2->m_face->m_edge_count, this->m_face_edge_count = uVar1,
     (ushort)(uVar1 + 0xf) < 0x12)) goto LAB_0061790a;
  local_28 = ON_SubDMeshFragment::SubDEdgePtr(pOVar2,grid_side_dex);
  this_00 = ON_SubDEdgePtr::Edge(&local_28);
  uVar5 = 0;
  if ((this_00 != (ON_SubDEdge *)0x0) && (1 < this_00->m_face_count)) {
    uVar5 = (this_00->super_ON_SubDComponentBase).m_id;
  }
  this->m_edge_id = uVar5;
  if (uVar5 == 0) goto LAB_0061790a;
  pOVar2 = this->m_fragment;
  bVar4 = ON_SubDMeshFragment::IsFullFaceFragment(pOVar2);
  if (bVar4) {
    bVar4 = true;
LAB_006178b3:
    bVar3 = false;
  }
  else {
    if (((pOVar2->m_face_vertex_index[0] < 0xfff1) || (pOVar2->m_face_vertex_index[1] < 0xfff1)) ||
       (0xffef < pOVar2->m_face_vertex_index[2])) {
      bVar4 = false;
      goto LAB_006178b3;
    }
    bVar4 = 0xfff0 < pOVar2->m_face_vertex_index[3];
    bVar3 = bVar4;
  }
  if (!bVar4) {
    ON_SubDIncrementErrorCount();
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_fragment.cpp"
               ,0xc52,"","Unexpected m_face_vertex[] falues in partial fragment.");
LAB_0061790a:
    this->m_edge_id = 0;
    this->m_bits = '\0';
    this->m_grid_side_dex = '\0';
    this->m_face_edge_count = 0;
    return false;
  }
  this->m_bits = '\0';
  OVar6 = ON_SubDEdgePtr::EdgeDirection(&local_28);
  if (bVar3) {
    if (grid_side_dex == 2) {
      bVar8 = 0x40;
      bVar7 = 0x80;
    }
    else {
      if (grid_side_dex != 1) goto LAB_0061790a;
      bVar8 = 0x80;
      bVar7 = 0x40;
    }
    if (OVar6 == 0) {
      bVar7 = bVar8;
    }
    this->m_bits = this->m_bits | bVar7;
  }
  if (OVar6 != 0) {
    this->m_bits = this->m_bits | 1;
  }
  bVar4 = ON_SubDEdge::IsSmooth(this_00);
  if (bVar4) {
    this->m_bits = this->m_bits | 2;
  }
  this->m_grid_side_dex = (uchar)grid_side_dex;
  return true;
}

Assistant:

bool SetEdge(
    unsigned int grid_side_dex
  )
  {
    for (;;)
    {
      if (nullptr == m_fragment || nullptr == m_fragment->m_face)
        break;

      m_face_edge_count = m_fragment->m_face->m_edge_count;
      if (m_face_edge_count < 3 || m_face_edge_count > ON_SubDFace::MaximumEdgeCount)
        break; // bogus face

      const ON_SubDEdgePtr eptr = m_fragment->SubDEdgePtr(grid_side_dex);
      const ON_SubDEdge* edge = eptr.Edge();
      m_edge_id = (nullptr != edge && edge->m_face_count >= 2) ? edge->m_id : 0;
      if (0 == m_edge_id)
        break; // nothing to seal

      const bool bCompleteFragment = m_fragment->IsFullFaceFragment();
      const bool bPartialFragment
        = (false == bCompleteFragment)
        && m_fragment->m_face_vertex_index[0] > ON_SubDFace::MaximumEdgeCount
        && m_fragment->m_face_vertex_index[1] > ON_SubDFace::MaximumEdgeCount
        && m_fragment->m_face_vertex_index[2] < ON_SubDFace::MaximumEdgeCount
        && m_fragment->m_face_vertex_index[3] > ON_SubDFace::MaximumEdgeCount
        ;

      if (false == bCompleteFragment && false == bPartialFragment)
      {
        ON_SUBD_ERROR("Unexpected m_face_vertex[] falues in partial fragment.");
        break;
      }

      m_bits = 0;
      const ON__UINT_PTR edge_dir = eptr.EdgeDirection();
      if (bPartialFragment)
      {
        // The high bit is used for partial fragments so they will sort after full fragments.
        if ( 1 == grid_side_dex )
          m_bits |= (0==edge_dir) ? Bits::SecondHalf : Bits::FirstHalf;
        else if ( 2 == grid_side_dex )
          m_bits |= (0==edge_dir) ? Bits::FirstHalf : Bits::SecondHalf;
        else
        {
          // this is an interior edge of a partial fragment and it
          // is always sealed with its neighbor when it is created.
          break;
        }
      }
      if (0 != edge_dir)
        m_bits |= Bits::EdgeDir;
      if (edge->IsSmooth())
        m_bits |= Bits::Smooth;

      m_grid_side_dex = (unsigned char)grid_side_dex; // 0,1,2, or 3

      return true;
    }


    m_edge_id = 0;
    m_bits = 0;
    m_grid_side_dex = 0;
    m_face_edge_count = 0;
    return false;
  }